

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::getChunkInfo
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  iterator __position;
  bool bVar3;
  size_type sVar4;
  uint uVar5;
  size_t sVar6;
  uchar *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  uchar *chunk;
  char type [5];
  char local_65 [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  pointer local_38;
  
  puVar2 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  chunk = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start + 8;
  paVar1 = &local_60.field_2;
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
  local_38 = chunk;
  do {
    if (puVar2 <= chunk + 8) {
      return 0;
    }
    if (chunk < local_38) {
      return 0;
    }
    lodepng_chunk_type(local_65,chunk);
    local_60._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(local_65);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_65,local_65 + sVar6);
    sVar4 = local_60._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (sVar4 == 4) {
      uVar5 = lodepng_chunk_length(chunk);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      sVar6 = strlen(local_65);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_65,local_65 + sVar6)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_40,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)uVar5;
      __position._M_current =
           (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      local_60._M_dataplus._M_p = (pointer)paVar8;
      if (__position._M_current ==
          (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (sizes,__position,(unsigned_long *)&local_60);
      }
      else {
        *__position._M_current = (unsigned_long)paVar8;
        (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (puVar2 < paVar8->_M_local_buf + 0xc + (long)chunk) goto LAB_0011b5e6;
      puVar7 = lodepng_chunk_next_const(chunk);
      bVar3 = chunk < puVar7;
      if (chunk < puVar7) {
        chunk = puVar7;
      }
    }
    else {
LAB_0011b5e6:
      bVar3 = false;
    }
    if (!bVar3) {
      return 1;
    }
  } while( true );
}

Assistant:

unsigned getChunkInfo(std::vector<std::string>& names, std::vector<size_t>& sizes,
                      const std::vector<unsigned char>& png) {
  // Listing chunks is based on the original file, not the decoded png info.
  const unsigned char *chunk, *begin, *end, *next;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    if(std::string(type).size() != 4) return 1;

    unsigned length = lodepng_chunk_length(chunk);
    names.push_back(type);
    sizes.push_back(length);
    if(chunk + length + 12 > end) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow
    chunk = next;
  }
  return 0;
}